

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_test.c
# Opt level: O1

void test_req_resend_reconnect(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  int local_88;
  char local_84;
  char buf_ [64];
  size_t sz_;
  nng_socket local_38;
  nng_socket rep1;
  nng_socket rep2;
  nng_socket req;
  
  nVar1 = nng_req0_open(&rep1);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0xd2,"%s: expected success, got %s (%d)","nng_req0_open(&req)",pcVar4,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_rep0_open((nng_socket *)((long)&sz_ + 4));
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                           ,0xd3,"%s: expected success, got %s (%d)","nng_rep0_open(&rep1)",pcVar4,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_rep0_open(&local_38);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                             ,0xd4,"%s: expected success, got %s (%d)","nng_rep0_open(&rep2)",pcVar4
                             ,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms(rep1,"recv-timeout",1000);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                               ,0xd6,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, SECOND)",pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_ms(sz_._4_4_,"recv-timeout",1000);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                 ,0xd7,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(rep1, NNG_OPT_RECVTIMEO, SECOND)",pcVar4,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_ms(local_38,"recv-timeout",1000);
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                   ,0xd8,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(rep2, NNG_OPT_RECVTIMEO, SECOND)",pcVar4,nVar1
                                  );
            if (iVar2 != 0) {
              nVar1 = nng_socket_set_ms(rep1,"send-timeout",1000);
              pcVar4 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                     ,0xd9,"%s: expected success, got %s (%d)",
                                     "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, SECOND)",pcVar4,
                                     nVar1);
              if (iVar2 != 0) {
                nVar1 = nng_socket_set_ms(sz_._4_4_,"send-timeout",1000);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                       ,0xda,"%s: expected success, got %s (%d)",
                                       "nng_socket_set_ms(rep1, NNG_OPT_SENDTIMEO, SECOND)",pcVar4,
                                       nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_socket_set_ms(local_38,"send-timeout",1000);
                  pcVar4 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                         ,0xdb,"%s: expected success, got %s (%d)",
                                         "nng_socket_set_ms(rep2, NNG_OPT_SENDTIMEO, SECOND)",pcVar4
                                         ,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_socket_set_ms(rep1,"req:resend-time",60000);
                    pcVar4 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                           ,0xde,"%s: expected success, got %s (%d)",
                                           "nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTIME, 60 * SECOND)"
                                           ,pcVar4,nVar1);
                    if (iVar2 != 0) {
                      nVar1 = nng_socket_set_ms(rep1,"req:resend-tick",100);
                      pcVar4 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                             ,0xe0,"%s: expected success, got %s (%d)",
                                             "nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTICK, SECOND / 10)"
                                             ,pcVar4,nVar1);
                      if (iVar2 != 0) {
                        nVar1 = nuts_marry(sz_._4_4_,rep1);
                        pcVar4 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                               ,0xe2,"%s: expected success, got %s (%d)",
                                               "nuts_marry(rep1, req)",pcVar4,nVar1);
                        if (iVar2 != 0) {
                          nVar1 = nng_send(rep1,"ping",5,0);
                          pcVar4 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                 ,0xe4,"%s: expected success, got %s (%d)",
                                                 "nng_send(req, \"ping\", strlen(\"ping\") + 1, 0)",
                                                 pcVar4,nVar1);
                          if (iVar2 != 0) {
                            buf_[0x38] = '@';
                            buf_[0x39] = '\0';
                            buf_[0x3a] = '\0';
                            buf_[0x3b] = '\0';
                            buf_[0x3c] = '\0';
                            buf_[0x3d] = '\0';
                            buf_[0x3e] = '\0';
                            buf_[0x3f] = '\0';
                            nVar3 = nng_recv(sz_._4_4_,&local_88,(size_t *)(buf_ + 0x38),0);
                            pcVar4 = nng_strerror(nVar3);
                            acutest_check_((uint)(nVar3 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                           ,0xe5,"nng_recv (%d %s)",(ulong)nVar3,pcVar4,nVar1);
                            acutest_check_((uint)(buf_._56_8_ == 5),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                           ,0xe5,"length %d want %d",buf_._56_8_,5);
                            buf_[0x37] = '\0';
                            acutest_check_((uint)(local_84 == '\0' && local_88 == 0x676e6970),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                           ,0xe5,"%s == %s","ping",&local_88);
                            nVar1 = nng_socket_close(sz_._4_4_);
                            pcVar4 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                  ,0xe7,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(rep1)",pcVar4,nVar1);
                            if (iVar2 != 0) {
                              nVar1 = nuts_marry(local_38,rep1);
                              pcVar4 = nng_strerror(nVar1);
                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                  ,0xe8,"%s: expected success, got %s (%d)",
                                                  "nuts_marry(rep2, req)",pcVar4,nVar1);
                              if (iVar2 != 0) {
                                buf_[0x38] = '@';
                                buf_[0x39] = '\0';
                                buf_[0x3a] = '\0';
                                buf_[0x3b] = '\0';
                                buf_[0x3c] = '\0';
                                buf_[0x3d] = '\0';
                                buf_[0x3e] = '\0';
                                buf_[0x3f] = '\0';
                                nVar3 = nng_recv(local_38,&local_88,(size_t *)(buf_ + 0x38),0);
                                pcVar4 = nng_strerror(nVar3);
                                acutest_check_((uint)(nVar3 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                               ,0xea,"nng_recv (%d %s)",(ulong)nVar3,pcVar4,nVar1);
                                acutest_check_((uint)(buf_._56_8_ == 5),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                               ,0xea,"length %d want %d",buf_._56_8_,5);
                                buf_[0x37] = '\0';
                                acutest_check_((uint)(local_84 == '\0' && local_88 == 0x676e6970),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                               ,0xea,"%s == %s","ping",&local_88);
                                nVar1 = nng_send(local_38,"rep2",5,0);
                                pcVar4 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                  ,0xeb,"%s: expected success, got %s (%d)",
                                                  "nng_send(rep2, \"rep2\", strlen(\"rep2\") + 1, 0)"
                                                  ,pcVar4,nVar1);
                                if (iVar2 != 0) {
                                  buf_[0x38] = '@';
                                  buf_[0x39] = '\0';
                                  buf_[0x3a] = '\0';
                                  buf_[0x3b] = '\0';
                                  buf_[0x3c] = '\0';
                                  buf_[0x3d] = '\0';
                                  buf_[0x3e] = '\0';
                                  buf_[0x3f] = '\0';
                                  nVar3 = nng_recv(rep1,&local_88,(size_t *)(buf_ + 0x38),0);
                                  pcVar4 = nng_strerror(nVar3);
                                  acutest_check_((uint)(nVar3 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                 ,0xec,"nng_recv (%d %s)",(ulong)nVar3,pcVar4,nVar1)
                                  ;
                                  acutest_check_((uint)(buf_._56_8_ == 5),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                 ,0xec,"length %d want %d",buf_._56_8_,5);
                                  buf_[0x37] = '\0';
                                  acutest_check_((uint)(local_84 == '\0' && local_88 == 0x32706572),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                 ,0xec,"%s == %s","rep2",&local_88);
                                  nVar1 = nng_socket_close(rep1);
                                  pcVar4 = nng_strerror(nVar1);
                                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                  ,0xee,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(req)",pcVar4,nVar1);
                                  if (iVar2 != 0) {
                                    nVar1 = nng_socket_close(local_38);
                                    pcVar4 = nng_strerror(nVar1);
                                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                                  ,0xef,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(rep2)",pcVar4,nVar1);
                                    if (iVar2 != 0) {
                                      return;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_req_resend_reconnect(void)
{
	nng_socket req;
	nng_socket rep1;
	nng_socket rep2;

	NUTS_PASS(nng_req0_open(&req));
	NUTS_PASS(nng_rep0_open(&rep1));
	NUTS_PASS(nng_rep0_open(&rep2));

	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep1, NNG_OPT_RECVTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep2, NNG_OPT_RECVTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep1, NNG_OPT_SENDTIMEO, SECOND));
	NUTS_PASS(nng_socket_set_ms(rep2, NNG_OPT_SENDTIMEO, SECOND));
	// We intentionally set the retry time long; that way we only see
	// the retry from loss of our original peer.
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTIME, 60 * SECOND));
	// And make sure the tick runs faster than our timeout!
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_REQ_RESENDTICK, SECOND / 10));

	NUTS_MARRY(rep1, req);

	NUTS_SEND(req, "ping");
	NUTS_RECV(rep1, "ping");

	NUTS_CLOSE(rep1);
	NUTS_MARRY(rep2, req);

	NUTS_RECV(rep2, "ping");
	NUTS_SEND(rep2, "rep2");
	NUTS_RECV(req, "rep2");

	NUTS_CLOSE(req);
	NUTS_CLOSE(rep2);
}